

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::UnknownFieldSetTest_ArenaSupportWorksWithMergeFrom_Test::TestBody
          (UnknownFieldSetTest_ArenaSupportWorksWithMergeFrom_Test *this)

{
  const_iterator pbVar1;
  UnknownFieldSet *local_188;
  UnknownFieldSet *local_178;
  UnknownFieldSet *rhs;
  UnknownFieldSet *lhs;
  UnknownFieldSet rhs_stack;
  undefined1 local_138 [8];
  UnknownFieldSet lhs_stack;
  bool rhs_arena;
  const_iterator __end3;
  const_iterator __begin3;
  initializer_list<bool> local_108;
  initializer_list<bool> *local_f8;
  initializer_list<bool> *__range3;
  const_iterator pbStack_e8;
  bool lhs_arena;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<bool> local_d0;
  initializer_list<bool> *local_c0;
  initializer_list<bool> *__range2;
  Arena arena;
  UnknownFieldSetTest_ArenaSupportWorksWithMergeFrom_Test *this_local;
  
  arena.impl_.first_arena_.cached_blocks_ = (CachedBlock **)this;
  Arena::Arena((Arena *)&__range2);
  __begin2._6_1_ = 0;
  __begin2._7_1_ = 1;
  local_d0._M_array = (iterator)((long)&__begin2 + 6);
  local_d0._M_len = 2;
  local_c0 = &local_d0;
  __end2 = std::initializer_list<bool>::begin(local_c0);
  pbStack_e8 = std::initializer_list<bool>::end(local_c0);
  for (; __end2 != pbStack_e8; __end2 = __end2 + 1) {
    __range3._7_1_ = *__end2 & 1;
    __begin3._6_1_ = 0;
    __begin3._7_1_ = 1;
    local_108._M_array = (iterator)((long)&__begin3 + 6);
    local_108._M_len = 2;
    local_f8 = &local_108;
    __end3 = std::initializer_list<bool>::begin(local_f8);
    pbVar1 = std::initializer_list<bool>::end(local_f8);
    for (; __end3 != pbVar1; __end3 = __end3 + 1) {
      lhs_stack.fields_.soo_rep_.field_0.long_rep.capacity._3_1_ = *__end3 & 1;
      UnknownFieldSet::UnknownFieldSet((UnknownFieldSet *)local_138);
      UnknownFieldSet::UnknownFieldSet((UnknownFieldSet *)&lhs);
      if ((__range3._7_1_ & 1) == 0) {
        local_178 = (UnknownFieldSet *)local_138;
      }
      else {
        local_178 = Arena::Create<google::protobuf::UnknownFieldSet>((Arena *)&__range2);
      }
      if ((lhs_stack.fields_.soo_rep_.field_0.long_rep.capacity._3_1_ & 1) == 0) {
        local_188 = (UnknownFieldSet *)&lhs;
      }
      else {
        local_188 = Arena::Create<google::protobuf::UnknownFieldSet>((Arena *)&__range2);
      }
      PopulateUFS(local_188);
      UnknownFieldSet::MergeFrom(local_178,local_188);
      UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)&lhs);
      UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)local_138);
    }
  }
  Arena::~Arena((Arena *)&__range2);
  return;
}

Assistant:

TEST_F(UnknownFieldSetTest, ArenaSupportWorksWithMergeFrom) {
  Arena arena;

  for (bool lhs_arena : {false, true}) {
    for (bool rhs_arena : {false, true}) {
      UnknownFieldSet lhs_stack, rhs_stack;
      auto& lhs =
          lhs_arena ? *Arena::Create<UnknownFieldSet>(&arena) : lhs_stack;
      auto& rhs =
          rhs_arena ? *Arena::Create<UnknownFieldSet>(&arena) : rhs_stack;
      PopulateUFS(rhs);
      lhs.MergeFrom(rhs);
    }
  }
}